

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetoraw_common(opj_image_t *image,char *outfile,OPJ_BOOL big_endian)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  opj_image_t *poVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__s;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  OPJ_UINT32 OVar13;
  OPJ_UINT32 *pOVar14;
  OPJ_UINT32 OVar15;
  ulong uVar16;
  uchar uc;
  anon_union_2_2_132597f0_conflict uc16_1;
  anon_union_2_2_132597f0 uc16;
  byte local_55;
  OPJ_UINT32 local_54;
  OPJ_UINT32 local_50;
  ushort local_4c;
  ushort local_4a;
  char *local_48;
  opj_image_t *local_40;
  ulong local_38;
  
  uVar1 = image->numcomps;
  if (image->x1 * uVar1 * image->y1 == 0) {
    imagetoraw_common_cold_3();
  }
  else {
    uVar4 = 4;
    if (uVar1 < 4) {
      uVar4 = uVar1;
    }
    uVar10 = 1;
    uVar11 = uVar10;
    if (1 < uVar1) {
      poVar2 = image->comps;
      pOVar14 = &poVar2[1].sgnd;
      do {
        uVar11 = uVar10;
        if ((((poVar2->dx != ((opj_image_comp_t *)(pOVar14 + -8))->dx) ||
             (poVar2->dy != pOVar14[-7])) || (poVar2->prec != pOVar14[-2])) ||
           (poVar2->sgnd != *pOVar14)) break;
        uVar10 = uVar10 + 1;
        pOVar14 = pOVar14 + 0x10;
        uVar11 = uVar4;
      } while (uVar4 != uVar10);
    }
    if (uVar11 == uVar4) {
      __s = fopen(outfile,"wb");
      if (__s != (FILE *)0x0) {
        iVar5 = 0;
        fprintf(_stdout,"Raw image characteristics: %d components\n",(ulong)image->numcomps);
        if (image->numcomps != 0) {
          uVar16 = 0;
          local_48 = outfile;
          local_40 = image;
LAB_0010c353:
          poVar3 = local_40;
          poVar2 = local_40->comps;
          pcVar7 = "unsigned";
          if (poVar2[uVar16].sgnd == 1) {
            pcVar7 = "signed";
          }
          fprintf(_stdout,"Component %u characteristics: %dx%dx%d %s\n",uVar16 & 0xffffffff,
                  (ulong)poVar2[uVar16].w,(ulong)poVar2[uVar16].h,(ulong)poVar2[uVar16].prec,pcVar7)
          ;
          poVar2 = poVar3->comps;
          local_50 = poVar2[uVar16].w;
          local_54 = poVar2[uVar16].h;
          uVar1 = poVar2[uVar16].prec;
          bVar9 = (byte)uVar1;
          local_38 = uVar16;
          if (8 < uVar1) {
            if (uVar1 < 0x11) {
              if (poVar2[uVar16].sgnd == 0) {
                if (0 < (int)local_54) {
                  piVar12 = poVar2[uVar16].data;
                  OVar13 = 0;
                  do {
                    OVar15 = local_50;
                    if (0 < (int)local_50) {
                      do {
                        iVar5 = *piVar12;
                        if (iVar5 < 1) {
                          iVar5 = 0;
                        }
                        if (0xfffe < iVar5) {
                          iVar5 = 0xffff;
                        }
                        local_4c = (ushort)iVar5 & ~(ushort)(-1 << (bVar9 & 0x1f));
                        sVar8 = fwrite(&local_4c,1,2,__s);
                        if (sVar8 < 2) goto LAB_0010c5e4;
                        piVar12 = piVar12 + 1;
                        OVar15 = OVar15 - 1;
                      } while (OVar15 != 0);
                    }
                    OVar13 = OVar13 + 1;
                  } while (OVar13 != local_54);
                }
              }
              else {
                if (poVar2[uVar16].sgnd != 1) goto LAB_0010c60a;
                if (0 < (int)local_54) {
                  piVar12 = poVar2[uVar16].data;
                  OVar13 = 0;
                  do {
                    OVar15 = local_50;
                    if (0 < (int)local_50) {
                      do {
                        iVar5 = *piVar12;
                        if (iVar5 < -0x7fff) {
                          iVar5 = -0x8000;
                        }
                        if (0x7ffe < iVar5) {
                          iVar5 = 0x7fff;
                        }
                        local_4a = (ushort)iVar5 & ~(ushort)(-1 << (bVar9 & 0x1f));
                        sVar8 = fwrite(&local_4a,1,2,__s);
                        if (sVar8 < 2) goto LAB_0010c5e4;
                        piVar12 = piVar12 + 1;
                        OVar15 = OVar15 - 1;
                      } while (OVar15 != 0);
                    }
                    OVar13 = OVar13 + 1;
                  } while (OVar13 != local_54);
                }
              }
              iVar6 = 0;
              goto LAB_0010c606;
            }
            if (uVar1 < 0x21) {
              imagetoraw_common_cold_2();
            }
            else {
              fprintf(_stderr,"Error: invalid precision: %d\n",(ulong)uVar1);
            }
            goto LAB_0010c645;
          }
          if (poVar2[uVar16].sgnd == 0) {
            if (0 < (int)local_54) {
              piVar12 = poVar2[uVar16].data;
              OVar13 = 0;
              do {
                OVar15 = local_50;
                if (0 < (int)local_50) {
                  do {
                    iVar5 = *piVar12;
                    if (iVar5 < 1) {
                      iVar5 = 0;
                    }
                    if (0xfe < iVar5) {
                      iVar5 = 0xff;
                    }
                    local_55 = (byte)iVar5 & ~(byte)(-1 << (bVar9 & 0x1f));
                    sVar8 = fwrite(&local_55,1,1,__s);
                    if (sVar8 == 0) goto LAB_0010c628;
                    piVar12 = piVar12 + 1;
                    OVar15 = OVar15 - 1;
                  } while (OVar15 != 0);
                }
                OVar13 = OVar13 + 1;
              } while (OVar13 != local_54);
            }
          }
          else if ((poVar2[uVar16].sgnd == 1) && (0 < (int)local_54)) {
            piVar12 = poVar2[uVar16].data;
            OVar13 = 0;
            do {
              OVar15 = local_50;
              if (0 < (int)local_50) {
                do {
                  iVar5 = *piVar12;
                  if (iVar5 < -0x7f) {
                    iVar5 = -0x80;
                  }
                  if (0x7e < iVar5) {
                    iVar5 = 0x7f;
                  }
                  local_55 = (byte)iVar5 & ~(byte)(-1 << (bVar9 & 0x1f));
                  sVar8 = fwrite(&local_55,1,1,__s);
                  if (sVar8 == 0) goto LAB_0010c628;
                  piVar12 = piVar12 + 1;
                  OVar15 = OVar15 - 1;
                } while (OVar15 != 0);
              }
              OVar13 = OVar13 + 1;
            } while (OVar13 != local_54);
          }
          goto LAB_0010c60a;
        }
        goto LAB_0010c64a;
      }
      fprintf(_stderr,"Failed to open %s for writing !!\n",outfile);
    }
    else {
      imagetoraw_common_cold_1();
    }
  }
  return 1;
LAB_0010c5e4:
  fprintf(_stderr,"failed to write 2 byte for %s\n",local_48);
  iVar6 = 0xe;
LAB_0010c606:
  if (iVar6 != 0) {
    iVar5 = 1;
    if (iVar6 != 0xe) {
      return 1;
    }
    goto LAB_0010c64a;
  }
LAB_0010c60a:
  uVar16 = local_38 + 1;
  if (local_40->numcomps <= uVar16) goto code_r0x0010c624;
  goto LAB_0010c353;
LAB_0010c628:
  fprintf(_stderr,"failed to write 1 byte for %s\n",local_48);
LAB_0010c645:
  iVar5 = 1;
  goto LAB_0010c64a;
code_r0x0010c624:
  iVar5 = 0;
LAB_0010c64a:
  fclose(__s);
  return iVar5;
}

Assistant:

static int imagetoraw_common(opj_image_t * image, const char *outfile,
                             OPJ_BOOL big_endian)
{
    FILE *rawFile = NULL;
    size_t res;
    unsigned int compno, numcomps;
    int w, h, fails;
    int line, row, curr, mask;
    int *ptr;
    unsigned char uc;
    (void)big_endian;

    if ((image->numcomps * image->x1 * image->y1) == 0) {
        fprintf(stderr, "\nError: invalid raw image parameters\n");
        return 1;
    }

    numcomps = image->numcomps;

    if (numcomps > 4) {
        numcomps = 4;
    }

    for (compno = 1; compno < numcomps; ++compno) {
        if (image->comps[0].dx != image->comps[compno].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[compno].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[compno].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[compno].sgnd) {
            break;
        }
    }
    if (compno != numcomps) {
        fprintf(stderr,
                "imagetoraw_common: All components shall have the same subsampling, same bit depth, same sign.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    rawFile = fopen(outfile, "wb");
    if (!rawFile) {
        fprintf(stderr, "Failed to open %s for writing !!\n", outfile);
        return 1;
    }

    fails = 1;
    fprintf(stdout, "Raw image characteristics: %d components\n", image->numcomps);

    for (compno = 0; compno < image->numcomps; compno++) {
        fprintf(stdout, "Component %u characteristics: %dx%dx%d %s\n", compno,
                image->comps[compno].w,
                image->comps[compno].h, image->comps[compno].prec,
                image->comps[compno].sgnd == 1 ? "signed" : "unsigned");

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        if (image->comps[compno].prec <= 8) {
            if (image->comps[compno].sgnd == 1) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 127) {
                            curr = 127;
                        } else if (curr < -128) {
                            curr = -128;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 255) {
                            curr = 255;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc = (unsigned char)(curr & mask);
                        res = fwrite(&uc, 1, 1, rawFile);
                        if (res < 1) {
                            fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 16) {
            if (image->comps[compno].sgnd == 1) {
                union {
                    signed short val;
                    signed char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 32767) {
                            curr = 32767;
                        } else if (curr < -32768) {
                            curr = -32768;
                        }
                        uc16.val = (signed short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            } else if (image->comps[compno].sgnd == 0) {
                union {
                    unsigned short val;
                    unsigned char vals[2];
                } uc16;
                mask = (1 << image->comps[compno].prec) - 1;
                ptr = image->comps[compno].data;
                for (line = 0; line < h; line++) {
                    for (row = 0; row < w; row++)    {
                        curr = *ptr;
                        if (curr > 65535) {
                            curr = 65535;
                        } else if (curr < 0) {
                            curr = 0;
                        }
                        uc16.val = (unsigned short)(curr & mask);
                        res = fwrite(uc16.vals, 1, 2, rawFile);
                        if (res < 2) {
                            fprintf(stderr, "failed to write 2 byte for %s\n", outfile);
                            goto fin;
                        }
                        ptr++;
                    }
                }
            }
        } else if (image->comps[compno].prec <= 32) {
            fprintf(stderr, "More than 16 bits per component not handled yet\n");
            goto fin;
        } else {
            fprintf(stderr, "Error: invalid precision: %d\n", image->comps[compno].prec);
            goto fin;
        }
    }
    fails = 0;
fin:
    fclose(rawFile);
    return fails;
}